

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

ValueT * Qentem::JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::parseValue
                   (ValueT *__return_storage_ptr__,StringStream<char16_t> *stream,char16_t *content,
                   SizeT *offset,SizeT length)

{
  char16_t cVar1;
  QNumberType QVar2;
  bool bVar3;
  QNumber64 local_70;
  QNumber64 number;
  char16_t *null_string;
  char16_t *false_string;
  char16_t *true_string;
  SizeT local_3c;
  char16_t *pcStack_38;
  SizeT len;
  char16_t *str;
  SizeT *pSStack_28;
  SizeT length_local;
  SizeT *offset_local;
  char16_t *content_local;
  StringStream<char16_t> *stream_local;
  
  cVar1 = content[*offset];
  str._4_4_ = length;
  pSStack_28 = offset;
  offset_local = (SizeT *)content;
  content_local = (char16_t *)stream;
  stream_local = (StringStream<char16_t> *)__return_storage_ptr__;
  if (cVar1 == L'\"') {
    *offset = *offset + 1;
    pcStack_38 = content + *offset;
    local_3c = JSONUtils::UnEscape<char16_t,Qentem::StringStream<char16_t>>
                         (pcStack_38,length - *offset,stream);
    if (local_3c != 0) {
      *pSStack_28 = local_3c + *pSStack_28;
      local_3c = local_3c - 1;
      bVar3 = StringStream<char16_t>::IsNotEmpty((StringStream<char16_t> *)content_local);
      if (bVar3) {
        pcStack_38 = StringStream<char16_t>::First((StringStream<char16_t> *)content_local);
        local_3c = StringStream<char16_t>::Length((StringStream<char16_t> *)content_local);
        StringStream<char16_t>::Clear((StringStream<char16_t> *)content_local);
      }
      String<char16_t>::String((String<char16_t> *)&true_string,pcStack_38,local_3c);
      Value<char16_t>::Value(__return_storage_ptr__,(StringT *)&true_string);
      String<char16_t>::~String((String<char16_t> *)&true_string);
      return __return_storage_ptr__;
    }
    local_3c = 0;
  }
  else {
    if (cVar1 == L'[') {
      *offset = *offset + 1;
      parseArray(__return_storage_ptr__,stream,content,offset,length);
      return __return_storage_ptr__;
    }
    if (cVar1 == L'f') {
      null_string = L"alse";
      *offset = *offset + 1;
      while( true ) {
        bVar3 = false;
        if (*offset < length) {
          bVar3 = content[*offset] == *null_string;
        }
        if (!bVar3) break;
        null_string = null_string + 1;
        *offset = *offset + 1;
      }
      if (*null_string == L'\0') {
        Value<char16_t>::Value(__return_storage_ptr__,False);
        return __return_storage_ptr__;
      }
    }
    else if (cVar1 == L'n') {
      number.Natural = 0x12fda6;
      *offset = *offset + 1;
      while( true ) {
        bVar3 = false;
        if (*offset < length) {
          bVar3 = content[*offset] == *(char16_t *)number;
        }
        if (!bVar3) break;
        number.Natural = number.Natural + 2;
        *offset = *offset + 1;
      }
      if (*(short *)number == 0) {
        Value<char16_t>::Value(__return_storage_ptr__,Null);
        return __return_storage_ptr__;
      }
    }
    else if (cVar1 == L't') {
      false_string = L"rue";
      *offset = *offset + 1;
      while( true ) {
        bVar3 = false;
        if (*offset < length) {
          bVar3 = content[*offset] == *false_string;
        }
        if (!bVar3) break;
        false_string = false_string + 1;
        *offset = *offset + 1;
      }
      if (*false_string == L'\0') {
        Value<char16_t>::Value(__return_storage_ptr__,True);
        return __return_storage_ptr__;
      }
    }
    else {
      if (cVar1 == L'{') {
        *offset = *offset + 1;
        parseObject(__return_storage_ptr__,stream,content,offset,length);
        return __return_storage_ptr__;
      }
      QNumber64::QNumber64((QNumber64 *)&local_70);
      QVar2 = Digit::StringToNumber<char16_t>
                        (&local_70,(char16_t *)offset_local,pSStack_28,str._4_4_);
      if (QVar2 == Real) {
        Value<char16_t>::Value(__return_storage_ptr__,local_70.Real);
        return __return_storage_ptr__;
      }
      if (QVar2 == Natural) {
        Value<char16_t>::Value(__return_storage_ptr__,local_70.Natural);
        return __return_storage_ptr__;
      }
      if (QVar2 == Integer) {
        Value<char16_t>::Value(__return_storage_ptr__,local_70.Integer);
        return __return_storage_ptr__;
      }
    }
  }
  *pSStack_28 = str._4_4_;
  Value<char16_t>::Value(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static ValueT parseValue(Stream_T &stream, const Char_T *content, SizeT &offset, const SizeT length) {
            switch (content[offset]) {
                case JSONotation::SCurlyChar: {
                    ++offset;
                    return parseObject(stream, content, offset, length);
                }

                case JSONotation::SSquareChar: {
                    ++offset;
                    return parseArray(stream, content, offset, length);
                }

                case JSONotation::QuoteChar: {
                    ++offset;

                    const Char_T *str = (content + offset);
                    SizeT         len = JSONUtils::UnEscape(str, (length - offset), stream);

                    if (len != 0) {
                        offset += len;
                        --len;

                        if (stream.IsNotEmpty()) {
                            str = stream.First();
                            len = stream.Length();
                            stream.Clear();
                        }

                        return ValueT{String<Char_T>{str, len}};
                    }

                    break;
                }

                case JSONotation::T_Char: {
                    const Char_T *true_string = (JSONotation::TrueString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *true_string)) {
                        ++true_string;
                        ++offset;
                    }

                    if (*true_string == Char_T{0}) {
                        return ValueT{ValueType::True};
                    }

                    break;
                }

                case JSONotation::F_Char: {
                    const Char_T *false_string = (JSONotation::FalseString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *false_string)) {
                        ++false_string;
                        ++offset;
                    }

                    if (*false_string == Char_T{0}) {
                        return ValueT{ValueType::False};
                    }

                    break;
                }

                case JSONotation::N_Char: {
                    const Char_T *null_string = (JSONotation::NullString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *null_string)) {
                        ++null_string;
                        ++offset;
                    }

                    if (*null_string == Char_T{0}) {
                        return ValueT{ValueType::Null};
                    }

                    break;
                }

                default: {
                    QNumber64 number;

                    switch (Digit::StringToNumber(number, content, offset, length)) {
                        case QNumberType::Natural: {
                            return ValueT{number.Natural};
                        }

                        case QNumberType::Integer: {
                            return ValueT{number.Integer};
                        }

                        case QNumberType::Real: {
                            return ValueT{number.Real};
                        }

                        default: {
                        }
                    };
                }
            }

            offset = length;
            return ValueT{};
        }